

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appendTest.cpp
# Opt level: O2

int main(void)

{
  Node *pNVar1;
  int iVar2;
  LinkedList *this;
  int iVar3;
  Node *pNVar4;
  Node *head;
  
  head = (Node *)0x0;
  this = (LinkedList *)operator_new(1);
  for (iVar3 = 1; iVar3 != 0x65; iVar3 = iVar3 + 1) {
    LinkedList::append(this,&head,iVar3);
  }
  LinkedList::printList(this,head);
  iVar3 = 100;
  pNVar1 = head;
  do {
    pNVar4 = pNVar1;
    pNVar1 = pNVar4->next;
    iVar3 = iVar3 + -1;
  } while (pNVar1 != (Node *)0x0);
  if ((head->data != 1) || (iVar2 = 0, pNVar4->data != 100 || iVar3 != 0)) {
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int main() {
	Node* head = nullptr;
	int counter = 1;
	LinkedList* test = new LinkedList();

	for (int i = 0; i < 100; i++) {
	 	test->append(&head, i + 1);
	}

	test->printList(head);

	Node* loopInstance = head;
	while (loopInstance->next != nullptr) {
		loopInstance = loopInstance->next;
		counter++;
	}

	if (head->data == 1 && loopInstance->data == 100 && counter == 100) {
		return 0;
	} else {
		return 1;
	}
}